

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_rank_many(roaring_bitmap_t *bm,uint32_t *begin,uint32_t *end,uint64_t *ans)

{
  ushort uVar1;
  uint8_t uVar2;
  int iVar3;
  uint uVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  uint uVar7;
  uint64_t *puVar8;
  ulong uVar9;
  int iVar10;
  uint64_t start_rank;
  run_container_t *prVar11;
  ulong uVar12;
  uint64_t uVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  
  if (begin != end && 0 < (bm->high_low_container).size) {
    start_rank = 0;
    iVar10 = 0;
    do {
      uVar4 = *begin;
      uVar7 = uVar4 >> 0x10;
      uVar15 = (uint)(bm->high_low_container).keys[iVar10];
      if (uVar15 < uVar7) {
        prVar11 = (run_container_t *)(bm->high_low_container).containers[iVar10];
        uVar2 = (bm->high_low_container).typecodes[iVar10];
        if (uVar2 == '\x04') {
          uVar2 = *(uint8_t *)&prVar11->runs;
          prVar11 = *(run_container_t **)prVar11;
        }
        if (uVar2 == '\x03') {
          iVar3 = run_container_cardinality(prVar11);
        }
        else {
          iVar3 = prVar11->n_runs;
        }
        start_rank = start_rank + (long)iVar3;
        iVar10 = iVar10 + 1;
      }
      else if (uVar7 == uVar15) {
        prVar11 = (run_container_t *)(bm->high_low_container).containers[iVar10];
        uVar2 = (bm->high_low_container).typecodes[iVar10];
        if (uVar2 == '\x04') {
          uVar2 = *(uint8_t *)&prVar11->runs;
          prVar11 = *(run_container_t **)prVar11;
        }
        if (uVar2 == '\x03') {
          uVar4 = run_container_rank_many(prVar11,start_rank,begin,end,ans);
        }
        else if (uVar2 == '\x02') {
          puVar6 = end;
          if (begin != end) {
            uVar7 = 0;
            puVar5 = begin;
            puVar8 = ans;
            do {
              puVar6 = puVar5;
              if (0xffff < (*puVar5 ^ uVar4)) break;
              uVar12 = (ulong)uVar7;
              iVar3 = prVar11->n_runs - uVar7;
              if (iVar3 < 1) {
                uVar9 = 0;
              }
              else {
                iVar3 = iVar3 + -1;
                uVar9 = 0;
                do {
                  uVar15 = iVar3 + (int)uVar9;
                  uVar16 = uVar15 >> 1;
                  uVar1 = *(ushort *)
                           ((long)&prVar11->runs->value + (ulong)(uVar15 & 0xfffffffe) + uVar12 * 2)
                  ;
                  uVar14 = (ushort)*puVar5;
                  if (uVar1 < uVar14) {
                    uVar9 = (ulong)(uVar16 + 1);
                  }
                  else {
                    if (uVar1 <= uVar14) {
                      uVar7 = uVar16 + 1;
                      uVar13 = uVar12 + start_rank + (ulong)uVar16 + 1;
                      goto LAB_0012785e;
                    }
                    iVar3 = uVar16 - 1;
                  }
                } while ((int)uVar9 <= iVar3);
              }
              uVar13 = uVar12 + start_rank + uVar9;
LAB_0012785e:
              *puVar8 = uVar13;
              puVar8 = puVar8 + 1;
              puVar5 = puVar5 + 1;
              puVar6 = end;
            } while (puVar5 != end);
          }
          uVar4 = (uint)((ulong)((long)puVar6 - (long)begin) >> 2);
        }
        else {
          uVar4 = bitset_container_rank_many((bitset_container_t *)prVar11,start_rank,begin,end,ans)
          ;
        }
        begin = begin + uVar4;
        ans = ans + uVar4;
      }
      else {
        *ans = start_rank;
        ans = ans + 1;
        begin = begin + 1;
      }
    } while ((iVar10 < (bm->high_low_container).size) && (begin != end));
  }
  return;
}

Assistant:

void roaring_bitmap_rank_many(const roaring_bitmap_t *bm, const uint32_t *begin,
                              const uint32_t *end, uint64_t *ans) {
    uint64_t size = 0;

    int i = 0;
    const uint32_t *iter = begin;
    while (i < bm->high_low_container.size && iter != end) {
        uint32_t x = *iter;
        uint32_t xhigh = x >> 16;
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            size +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
            i++;
        } else if (xhigh == key) {
            uint32_t consumed = container_rank_many(
                bm->high_low_container.containers[i],
                bm->high_low_container.typecodes[i], size, iter, end, ans);
            iter += consumed;
            ans += consumed;
        } else {
            *(ans++) = size;
            iter++;
        }
    }
}